

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdUtils.c
# Opt level: O2

char * CmdSplitLine(Abc_Frame_t *pAbc,char *sCommand,int *argc,char ***argv)

{
  bool bVar1;
  bool bVar2;
  char **__ptr;
  ushort **ppuVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  char cVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  
  __ptr = (char **)malloc(0x50);
  iVar8 = 10;
  ppuVar3 = __ctype_b_loc();
  uVar12 = 0;
LAB_002cf958:
  do {
    pcVar6 = sCommand;
    uVar10 = (ulong)*pcVar6;
    sCommand = pcVar6 + 1;
  } while ((*(byte *)((long)*ppuVar3 + uVar10 * 2 + 1) & 0x20) != 0);
  lVar13 = 0;
  bVar1 = false;
  bVar2 = false;
  do {
    cVar9 = (char)uVar10;
    if ((cVar9 == '#') || (((uint)uVar10 & 0xff) == 0x3b)) {
LAB_002cf994:
      if (!bVar1 && !bVar2) break;
    }
    else {
      if ((uVar10 & 0xff) == 0) goto LAB_002cf9c6;
      if ((*(byte *)((long)*ppuVar3 + (long)cVar9 * 2 + 1) & 0x20) != 0) goto LAB_002cf994;
    }
    if (cVar9 == '\'') {
      bVar1 = !bVar1;
    }
    if (cVar9 == '\"') {
      bVar2 = !bVar2;
    }
    uVar10 = (ulong)(byte)sCommand[lVar13];
    lVar13 = lVar13 + 1;
  } while( true );
  bVar1 = false;
  bVar2 = false;
LAB_002cf9c6:
  if (bVar1 || bVar2) {
    fwrite("** cmd warning: ignoring unbalanced quote ...\n",0x2e,1,(FILE *)pAbc->Err);
  }
  iVar11 = (int)uVar12;
  if (lVar13 == 0) {
    *argc = iVar11;
    *argv = __ptr;
    cVar9 = *pcVar6;
    if (cVar9 == '#') {
      while (cVar9 != '\0') {
        pcVar4 = pcVar6 + 1;
        pcVar6 = pcVar6 + 1;
        cVar9 = *pcVar4;
      }
    }
    else if (cVar9 == ';') {
      pcVar6 = sCommand;
    }
    return pcVar6;
  }
  sCommand = sCommand + lVar13 + -1;
  pcVar4 = (char *)malloc(lVar13 + 1);
  lVar5 = 0;
  if (lVar13 < 1) {
    lVar13 = lVar5;
  }
  iVar7 = 0;
  for (; lVar13 != lVar5; lVar5 = lVar5 + 1) {
    cVar9 = pcVar6[lVar5];
    if ((cVar9 != '\"') && (cVar9 != '\'')) {
      if (((*ppuVar3)[cVar9] >> 0xd & 1) != 0) {
        cVar9 = ' ';
      }
      pcVar4[iVar7] = cVar9;
      iVar7 = iVar7 + 1;
    }
  }
  pcVar4[iVar7] = '\0';
  if (iVar11 == iVar8) {
    uVar10 = (ulong)(uint)(iVar8 * 2);
    if (iVar8 < 0x10) {
      uVar10 = 0x10;
    }
    iVar7 = (int)uVar10;
    if (iVar8 < iVar7) {
      iVar8 = iVar7;
      if (__ptr == (char **)0x0) {
        __ptr = (char **)malloc(uVar10 << 3);
      }
      else {
        __ptr = (char **)realloc(__ptr,uVar10 << 3);
      }
    }
  }
  __ptr[uVar12] = pcVar4;
  uVar12 = (ulong)(iVar11 + 1);
  goto LAB_002cf958;
}

Assistant:

const char * CmdSplitLine( Abc_Frame_t * pAbc, const char *sCommand, int *argc, char ***argv )
{
    const char *p, *start;
    char c;
    int i, j;
    char *new_arg;
    Vec_Ptr_t * vArgs;
    int single_quote, double_quote;

    vArgs = Vec_PtrAlloc( 10 );

    p = sCommand;
    for ( ;; )
    {
        // skip leading white space 
        while ( isspace( ( int ) *p ) )
        {
            p++;
        }

        // skip until end of this token 
        single_quote = double_quote = 0;
        for ( start = p; ( c = *p ) != '\0'; p++ )
        {
            if ( c == ';' || c == '#' || isspace( ( int ) c ) )
            {
                if ( !single_quote && !double_quote )
                {
                    break;
                }
            }
            if ( c == '\'' )
            {
                single_quote = !single_quote;
            }
            if ( c == '"' )
            {
                double_quote = !double_quote;
            }
        }
        if ( single_quote || double_quote )
        {
            ( void ) fprintf( pAbc->Err, "** cmd warning: ignoring unbalanced quote ...\n" );
        }
        if ( start == p )
            break;

        new_arg = ABC_ALLOC( char, p - start + 1 );
        j = 0;
        for ( i = 0; i < p - start; i++ )
        {
            c = start[i];
            if ( ( c != '\'' ) && ( c != '\"' ) )
            {
                new_arg[j++] = isspace( ( int ) c ) ? ' ' : start[i];
            }
        }
        new_arg[j] = '\0';
        Vec_PtrPush( vArgs, new_arg );
    }

    *argc = vArgs->nSize;
    *argv = (char **)Vec_PtrReleaseArray( vArgs );
    Vec_PtrFree( vArgs );
    if ( *p == ';' )
    {
        p++;
    }
    else if ( *p == '#' )
    {
        for ( ; *p != 0; p++ ); // skip to end of line 
    }
    return p;
}